

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

EStatusCode __thiscall OpenTypeFileInput::ReadOpenTypeSFNT(OpenTypeFileInput *this)

{
  EStatusCode EVar1;
  Trace *this_00;
  int local_3c;
  unsigned_long uStack_38;
  int i;
  unsigned_long offsetTable;
  unsigned_long numFonts;
  unsigned_long ttcVersion;
  unsigned_long sfntVersion;
  OpenTypeFileInput *this_local;
  
  sfntVersion = (unsigned_long)this;
  OpenTypePrimitiveReader::SetOffset(&this->mPrimitivesReader,this->mHeaderOffset);
  OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&ttcVersion);
  EVar1 = OpenTypePrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  if (EVar1 == eSuccess) {
    if (ttcVersion == 0x74746366) {
      OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&numFonts);
      OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&offsetTable);
      if (this->mFaceIndex < offsetTable) {
        for (local_3c = 0; local_3c <= (int)(uint)this->mFaceIndex; local_3c = local_3c + 1) {
          OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&stack0xffffffffffffffc8);
        }
        this->mHeaderOffset = this->mHeaderOffset + uStack_38;
        this_local._4_4_ = ReadOpenTypeSFNT(this);
      }
      else {
        this_00 = Trace::DefaultTrace();
        Trace::TraceToLog(this_00,
                          "OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld"
                          ,(ulong)this->mFaceIndex,offsetTable);
        this_local._4_4_ = eFailure;
      }
    }
    else if ((ttcVersion == 0x10000) || (ttcVersion == 0x74727565)) {
      this->mFontType = EOpenTypeTrueType;
      this_local._4_4_ = eSuccess;
    }
    else if (ttcVersion == 0x4f54544f) {
      this->mFontType = EOpenTypeCFF;
      this_local._4_4_ = eSuccess;
    }
    else {
      EVar1 = ReadOpenTypeSFNTFromDfont(this);
      if (EVar1 == eSuccess) {
        this_local._4_4_ = eSuccess;
      }
      else {
        this_local._4_4_ = eFailure;
      }
    }
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOpenTypeSFNT()
{
	unsigned long sfntVersion;

    mPrimitivesReader.SetOffset(mHeaderOffset);
	mPrimitivesReader.ReadULONG(sfntVersion);
    
    if(mPrimitivesReader.GetInternalState() != PDFHummus::eSuccess)
    {
        return PDFHummus::eFailure;
    }
    
    if((0x74746366 /* ttcf */ == sfntVersion))
    {
        // mgubi: a TrueType composite font, just get to the right face table 
        // for the format see http://www.microsoft.com/typography/otspec/otff.htm
        
        unsigned long ttcVersion;
        unsigned long numFonts;
        unsigned long offsetTable;
        
        mPrimitivesReader.ReadULONG(ttcVersion);
        mPrimitivesReader.ReadULONG(numFonts);
        
        if (mFaceIndex >= numFonts) 
        {
            TRACE_LOG2("OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld",mFaceIndex,numFonts);
            return PDFHummus::eFailure;
        }
        
        for (int i= 0; i<= mFaceIndex; ++i) {
            mPrimitivesReader.ReadULONG(offsetTable);
        }
        
        mHeaderOffset = mHeaderOffset + offsetTable;
        
        return ReadOpenTypeSFNT();
    } else if((0x10000 == sfntVersion) || (0x74727565 /* true */ == sfntVersion))
	{
		mFontType = EOpenTypeTrueType;
		return PDFHummus::eSuccess;
	}
	else if(0x4F54544F /* OTTO */ == sfntVersion)
	{
		mFontType = EOpenTypeCFF;
		return PDFHummus::eSuccess;
	}
	else if ((ReadOpenTypeSFNTFromDfont() == PDFHummus::eSuccess))
    {
		return PDFHummus::eSuccess;
    }
    else
		return PDFHummus::eFailure;
}